

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

vector<void_*,_std::allocator<void_*>_> * __thiscall
google::protobuf::internal::ThreadSafeArena::PeekCleanupListForTesting
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,ThreadSafeArena *this)

{
  SerialArena *pSVar1;
  
  pSVar1 = GetSerialArena(this);
  cleanup::ChunkList::PeekForTesting(__return_storage_ptr__,&pSVar1->cleanup_list_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<void*> ThreadSafeArena::PeekCleanupListForTesting() {
  return GetSerialArena()->PeekCleanupListForTesting();
}